

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzvec.h
# Opt level: O0

void __thiscall TPZVec<TPZEqnArray<float>_>::ReallocForNuma(TPZVec<TPZEqnArray<float>_> *this)

{
  ulong uVar1;
  long lVar2;
  long lVar3;
  undefined1 auVar4 [16];
  ulong uVar5;
  ulong *puVar6;
  long lVar7;
  TPZEqnArray<float> *__dest;
  long in_RDI;
  ulong uVar8;
  TPZEqnArray<float> *newStore;
  TPZEqnArray<float> *in_stack_ffffffffffffff70;
  TPZEqnArray<float> *local_50;
  
  if ((*(long *)(in_RDI + 0x10) != 0) && (*(long *)(in_RDI + 8) != 0)) {
    uVar1 = *(ulong *)(in_RDI + 0x10);
    auVar4._8_8_ = 0;
    auVar4._0_8_ = uVar1;
    uVar5 = SUB168(auVar4 * ZEXT816(0x22f0),0);
    uVar8 = uVar5 + 8;
    if (SUB168(auVar4 * ZEXT816(0x22f0),8) != 0 || 0xfffffffffffffff7 < uVar5) {
      uVar8 = 0xffffffffffffffff;
    }
    puVar6 = (ulong *)operator_new__(uVar8);
    *puVar6 = uVar1;
    __dest = (TPZEqnArray<float> *)(puVar6 + 1);
    if (uVar1 != 0) {
      local_50 = __dest;
      do {
        TPZEqnArray<float>::TPZEqnArray(local_50);
        local_50 = local_50 + 1;
      } while (local_50 != __dest + uVar1);
    }
    memcpy(__dest,*(void **)(in_RDI + 8),*(long *)(in_RDI + 0x10) * 0x22f0);
    lVar2 = *(long *)(in_RDI + 8);
    if (lVar2 != 0) {
      lVar3 = *(long *)(lVar2 + -8);
      for (lVar7 = lVar2 + lVar3 * 0x22f0; lVar2 != lVar7; lVar7 = lVar7 + -0x22f0) {
        TPZEqnArray<float>::~TPZEqnArray(in_stack_ffffffffffffff70);
      }
      operator_delete__((void *)(lVar2 + -8),lVar3 * 0x22f0 + 8);
    }
    *(TPZEqnArray<float> **)(in_RDI + 8) = __dest;
  }
  return;
}

Assistant:

void ReallocForNuma() {
        if (fNElements == 0 || fStore == NULL)
            return;
        T* newStore = new T[fNElements];
        memcpy((void*)newStore,(void*)fStore,fNElements*sizeof(T));
        delete [] fStore;
        fStore = newStore;
	}